

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O2

void nn_btcp_start_listening(nn_btcp *self)

{
  nn_usock *self_00;
  FILE *__stream;
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  undefined8 uVar6;
  size_t sStack_e0;
  int ipv4only;
  size_t local_c8;
  size_t ipv4onlylen;
  sockaddr_storage local_b8;
  
  pcVar3 = nn_epbase_getaddr(&self->epbase);
  local_b8.ss_family = 0;
  local_b8.__ss_padding[0] = '\0';
  local_b8.__ss_padding[1] = '\0';
  local_b8.__ss_padding[2] = '\0';
  local_b8.__ss_padding[3] = '\0';
  local_b8.__ss_padding[4] = '\0';
  local_b8.__ss_padding[5] = '\0';
  local_b8.__ss_padding[6] = '\0';
  local_b8.__ss_padding[7] = '\0';
  local_b8.__ss_padding[8] = '\0';
  local_b8.__ss_padding[9] = '\0';
  local_b8.__ss_padding[10] = '\0';
  local_b8.__ss_padding[0xb] = '\0';
  local_b8.__ss_padding[0xc] = '\0';
  local_b8.__ss_padding[0xd] = '\0';
  local_b8.__ss_padding[0xe] = '\0';
  local_b8.__ss_padding[0xf] = '\0';
  local_b8.__ss_padding[0x10] = '\0';
  local_b8.__ss_padding[0x11] = '\0';
  local_b8.__ss_padding[0x12] = '\0';
  local_b8.__ss_padding[0x13] = '\0';
  local_b8.__ss_padding[0x14] = '\0';
  local_b8.__ss_padding[0x15] = '\0';
  local_b8.__ss_padding[0x16] = '\0';
  local_b8.__ss_padding[0x17] = '\0';
  local_b8.__ss_padding[0x18] = '\0';
  local_b8.__ss_padding[0x19] = '\0';
  local_b8.__ss_padding[0x1a] = '\0';
  local_b8.__ss_padding[0x1b] = '\0';
  local_b8.__ss_padding[0x1c] = '\0';
  local_b8.__ss_padding[0x1d] = '\0';
  local_b8.__ss_padding[0x1e] = '\0';
  local_b8.__ss_padding[0x1f] = '\0';
  local_b8.__ss_padding[0x20] = '\0';
  local_b8.__ss_padding[0x21] = '\0';
  local_b8.__ss_padding[0x22] = '\0';
  local_b8.__ss_padding[0x23] = '\0';
  local_b8.__ss_padding[0x24] = '\0';
  local_b8.__ss_padding[0x25] = '\0';
  local_b8.__ss_padding[0x26] = '\0';
  local_b8.__ss_padding[0x27] = '\0';
  local_b8.__ss_padding[0x28] = '\0';
  local_b8.__ss_padding[0x29] = '\0';
  local_b8.__ss_padding[0x2a] = '\0';
  local_b8.__ss_padding[0x2b] = '\0';
  local_b8.__ss_padding[0x2c] = '\0';
  local_b8.__ss_padding[0x2d] = '\0';
  local_b8.__ss_padding[0x2e] = '\0';
  local_b8.__ss_padding[0x2f] = '\0';
  local_b8.__ss_padding[0x30] = '\0';
  local_b8.__ss_padding[0x31] = '\0';
  local_b8.__ss_padding[0x32] = '\0';
  local_b8.__ss_padding[0x33] = '\0';
  local_b8.__ss_padding[0x34] = '\0';
  local_b8.__ss_padding[0x35] = '\0';
  local_b8.__ss_padding[0x36] = '\0';
  local_b8.__ss_padding[0x37] = '\0';
  local_b8.__ss_padding[0x38] = '\0';
  local_b8.__ss_padding[0x39] = '\0';
  local_b8.__ss_padding[0x3a] = '\0';
  local_b8.__ss_padding[0x3b] = '\0';
  local_b8.__ss_padding[0x3c] = '\0';
  local_b8.__ss_padding[0x3d] = '\0';
  local_b8.__ss_padding[0x3e] = '\0';
  local_b8.__ss_padding[0x3f] = '\0';
  local_b8.__ss_padding[0x40] = '\0';
  local_b8.__ss_padding[0x41] = '\0';
  local_b8.__ss_padding[0x42] = '\0';
  local_b8.__ss_padding[0x43] = '\0';
  local_b8.__ss_padding[0x44] = '\0';
  local_b8.__ss_padding[0x45] = '\0';
  local_b8.__ss_padding[0x46] = '\0';
  local_b8.__ss_padding[0x47] = '\0';
  local_b8.__ss_padding[0x48] = '\0';
  local_b8.__ss_padding[0x49] = '\0';
  local_b8.__ss_padding[0x4a] = '\0';
  local_b8.__ss_padding[0x4b] = '\0';
  local_b8.__ss_padding[0x4c] = '\0';
  local_b8.__ss_padding[0x4d] = '\0';
  local_b8.__ss_padding[0x4e] = '\0';
  local_b8.__ss_padding[0x4f] = '\0';
  local_b8.__ss_padding[0x50] = '\0';
  local_b8.__ss_padding[0x51] = '\0';
  local_b8.__ss_padding[0x52] = '\0';
  local_b8.__ss_padding[0x53] = '\0';
  local_b8.__ss_padding[0x54] = '\0';
  local_b8.__ss_padding[0x55] = '\0';
  local_b8.__ss_padding[0x56] = '\0';
  local_b8.__ss_padding[0x57] = '\0';
  local_b8.__ss_padding[0x58] = '\0';
  local_b8.__ss_padding[0x59] = '\0';
  local_b8.__ss_padding[0x5a] = '\0';
  local_b8.__ss_padding[0x5b] = '\0';
  local_b8.__ss_padding[0x5c] = '\0';
  local_b8.__ss_padding[0x5d] = '\0';
  local_b8.__ss_padding[0x5e] = '\0';
  local_b8.__ss_padding[0x5f] = '\0';
  local_b8.__ss_padding[0x60] = '\0';
  local_b8.__ss_padding[0x61] = '\0';
  local_b8.__ss_padding[0x62] = '\0';
  local_b8.__ss_padding[99] = '\0';
  local_b8.__ss_padding[100] = '\0';
  local_b8.__ss_padding[0x65] = '\0';
  local_b8.__ss_padding[0x66] = '\0';
  local_b8.__ss_padding[0x67] = '\0';
  local_b8.__ss_padding[0x68] = '\0';
  local_b8.__ss_padding[0x69] = '\0';
  local_b8.__ss_padding[0x6a] = '\0';
  local_b8.__ss_padding[0x6b] = '\0';
  local_b8.__ss_padding[0x6c] = '\0';
  local_b8.__ss_padding[0x6d] = '\0';
  local_b8.__ss_padding[0x6e] = '\0';
  local_b8.__ss_padding[0x6f] = '\0';
  local_b8.__ss_padding[0x70] = '\0';
  local_b8.__ss_padding[0x71] = '\0';
  local_b8.__ss_padding[0x72] = '\0';
  local_b8.__ss_padding[0x73] = '\0';
  local_b8.__ss_padding[0x74] = '\0';
  local_b8.__ss_padding[0x75] = '\0';
  local_b8.__ss_align = 0;
  pcVar4 = strrchr(pcVar3,0x3a);
  if (pcVar4 == (char *)0x0) {
    pcVar3 = "pos";
    uVar6 = 0x1ba;
  }
  else {
    sVar5 = strlen(pcVar3);
    pcVar4 = pcVar4 + 1;
    iVar1 = nn_port_resolve(pcVar4,(size_t)(pcVar3 + (sVar5 - (long)pcVar4)));
    if (iVar1 < 0) {
      pcVar3 = "rc >= 0";
      uVar6 = 0x1bd;
    }
    else {
      ipv4onlylen = 4;
      nn_epbase_getopt(&self->epbase,0,0xe,&ipv4only,&ipv4onlylen);
      if (ipv4onlylen == 4) {
        iVar2 = nn_iface_resolve(pcVar3,(size_t)(pcVar4 + ~(ulong)pcVar3),ipv4only,&local_b8,
                                 &local_c8);
        __stream = _stderr;
        if (iVar2 != 0) {
          pcVar3 = nn_err_strerror(-iVar2);
          fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)(uint)-iVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
                  ,0x1c6);
          goto LAB_00124d5f;
        }
        if (local_b8.ss_family == 2) {
          sStack_e0 = 0x10;
LAB_00124c22:
          local_b8.__ss_padding._0_2_ = (ushort)iVar1 << 8 | (ushort)iVar1 >> 8;
          local_c8 = sStack_e0;
          self_00 = &self->usock;
          iVar1 = nn_usock_start(self_00,(uint)local_b8.ss_family,1,0);
          if (iVar1 < 0) {
            nn_backoff_start(&self->retry);
            self->state = 7;
          }
          else {
            iVar1 = nn_usock_bind(self_00,(sockaddr *)&local_b8,local_c8);
            if ((-1 < iVar1) && (iVar1 = nn_usock_listen(self_00,100), -1 < iVar1)) {
              nn_btcp_start_accepting(self);
              self->state = 2;
              return;
            }
            nn_usock_stop(self_00);
            self->state = 8;
          }
          return;
        }
        if (local_b8.ss_family == 10) {
          sStack_e0 = 0x1c;
          goto LAB_00124c22;
        }
        pcVar3 = "0";
        uVar6 = 0x1d2;
      }
      else {
        pcVar3 = "ipv4onlylen == sizeof (ipv4only)";
        uVar6 = 0x1c4;
      }
    }
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar3,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
          ,uVar6);
LAB_00124d5f:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_btcp_start_listening (struct nn_btcp *self)
{
    int rc;
    struct sockaddr_storage ss;
    size_t sslen;
    int ipv4only;
    size_t ipv4onlylen;
    const char *addr;
    const char *end;
    const char *pos;
    uint16_t port;

    /*  First, resolve the IP address. */
    addr = nn_epbase_getaddr (&self->epbase);
    memset (&ss, 0, sizeof (ss));

    /*  Parse the port. */
    end = addr + strlen (addr);
    pos = strrchr (addr, ':');
    nn_assert (pos);
    ++pos;
    rc = nn_port_resolve (pos, end - pos);
    nn_assert (rc >= 0);
    port = rc;

    /*  Parse the address. */
    ipv4onlylen = sizeof (ipv4only);
    nn_epbase_getopt (&self->epbase, NN_SOL_SOCKET, NN_IPV4ONLY,
        &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));
    rc = nn_iface_resolve (addr, pos - addr - 1, ipv4only, &ss, &sslen);
    errnum_assert (rc == 0, -rc);

    /*  Combine the port and the address. */
    if (ss.ss_family == AF_INET) {
        ((struct sockaddr_in*) &ss)->sin_port = htons (port);
        sslen = sizeof (struct sockaddr_in);
    }
    else if (ss.ss_family == AF_INET6) {
        ((struct sockaddr_in6*) &ss)->sin6_port = htons (port);
        sslen = sizeof (struct sockaddr_in6);
    }
    else
        nn_assert (0);

    /*  Start listening for incoming connections. */
    rc = nn_usock_start (&self->usock, ss.ss_family, SOCK_STREAM, 0);
    if (nn_slow (rc < 0)) {
        nn_backoff_start (&self->retry);
        self->state = NN_BTCP_STATE_WAITING;
        return;
    }

    rc = nn_usock_bind (&self->usock, (struct sockaddr*) &ss, (size_t) sslen);
    if (nn_slow (rc < 0)) {
        nn_usock_stop (&self->usock);
        self->state = NN_BTCP_STATE_CLOSING;
        return;
    }

    rc = nn_usock_listen (&self->usock, NN_BTCP_BACKLOG);
    if (nn_slow (rc < 0)) {
        nn_usock_stop (&self->usock);
        self->state = NN_BTCP_STATE_CLOSING;
        return;
    }
    nn_btcp_start_accepting(self);
    self->state = NN_BTCP_STATE_ACTIVE;
}